

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Math.cpp
# Opt level: O3

void __thiscall MathInterpreter::separateInput(MathInterpreter *this,string *input_arg)

{
  byte bVar1;
  char cVar2;
  char *pcVar3;
  pointer pcVar4;
  list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *plVar5;
  _Node *p_Var6;
  undefined8 *puVar7;
  char cVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  undefined1 local_58 [8];
  string temp;
  
  local_58 = (undefined1  [8])&temp._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"");
  pcVar3 = (input_arg->_M_dataplus)._M_p;
  uVar10 = 0;
  if ((*pcVar3 == '-') && (1 < input_arg->_M_string_length)) {
    uVar11 = 0;
    if ((byte)(pcVar3[1] - 0x30U) < 10) {
      std::__cxx11::string::push_back((char)local_58);
      if (input_arg->_M_string_length < 2) {
        uVar10 = 1;
      }
      else {
        uVar10 = 1;
        uVar11 = 0;
        do {
          cVar8 = (input_arg->_M_dataplus)._M_p[uVar10];
          if (('9' < cVar8) || (cVar8 < '0' && cVar8 != '.')) break;
          std::__cxx11::string::push_back((char)local_58);
          uVar11 = uVar11 + (cVar8 == '.');
          uVar10 = (ulong)((int)uVar10 + 1);
        } while (uVar10 < input_arg->_M_string_length);
        if (1 < uVar11) {
          temp.field_2._8_8_ = "Invalid input";
LAB_0010d85d:
          puVar7 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar7 = temp.field_2._8_8_;
          __cxa_throw(puVar7,&char_const*::typeinfo,0);
        }
      }
      plVar5 = (list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this->input;
      p_Var6 = std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
               _M_create_node<std::__cxx11::string_const&>
                         (plVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_58);
      std::__detail::_List_node_base::_M_hook(&p_Var6->super__List_node_base);
      plVar5 = plVar5 + 0x10;
      *(long *)plVar5 = *(long *)plVar5 + 1;
      std::__cxx11::string::_M_replace((ulong)local_58,0,temp._M_dataplus._M_p,0x11031b);
    }
  }
  else {
    uVar11 = 0;
  }
  temp.field_2._8_8_ = anon_var_dwarf_7a1ba;
  do {
    if (input_arg->_M_string_length <= uVar10) {
      if (local_58 != (undefined1  [8])&temp._M_string_length) {
        operator_delete((void *)local_58,temp._M_string_length + 1);
      }
      return;
    }
    pcVar4 = (input_arg->_M_dataplus)._M_p;
    bVar1 = pcVar4[uVar10];
    if ('z' < (char)bVar1) goto LAB_0010d85d;
    uVar9 = (uint)uVar10;
    cVar8 = (char)(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58;
    if ((char)bVar1 < 'a') {
      if ('Z' < (char)bVar1) goto LAB_0010d85d;
      if ('@' < (char)bVar1) goto LAB_0010d614;
      if ('9' < (char)bVar1) goto LAB_0010d85d;
      if ((char)bVar1 < '0') {
        if ((3 < bVar1 - 0x28) && (bVar1 != 0x2f)) {
          if (bVar1 != 0x2d) goto LAB_0010d85d;
          if (((uVar10 != 0 && (ulong)(uVar9 + 1) < input_arg->_M_string_length) &&
              (pcVar4[uVar9 - 1] == '(')) && ((byte)(pcVar4[uVar9 + 1] - 0x30U) < 10)) {
            std::__cxx11::string::push_back(cVar8);
            std::__cxx11::string::push_back(cVar8);
            uVar9 = uVar9 + 2;
            while (((uVar10 = (ulong)uVar9, uVar10 < input_arg->_M_string_length &&
                    (cVar2 = (input_arg->_M_dataplus)._M_p[uVar10], cVar2 < ':')) &&
                   ('/' < cVar2 || cVar2 == '.'))) {
              std::__cxx11::string::push_back(cVar8);
              uVar11 = uVar11 + (cVar2 == '.');
              uVar9 = uVar9 + 1;
            }
            goto LAB_0010d7a1;
          }
        }
        std::__cxx11::string::push_back(cVar8);
        uVar10 = (ulong)(uVar9 + 1);
      }
      else {
        std::__cxx11::string::push_back(cVar8);
        while( true ) {
          uVar9 = uVar9 + 1;
          uVar10 = (ulong)uVar9;
          if (((input_arg->_M_string_length <= uVar10) ||
              (cVar2 = (input_arg->_M_dataplus)._M_p[uVar10], '9' < cVar2)) ||
             (cVar2 < '0' && cVar2 != '.')) break;
          uVar11 = uVar11 + (cVar2 == '.');
          std::__cxx11::string::push_back(cVar8);
        }
        if (1 < uVar11) {
          temp.field_2._8_8_ = "invalid input_arg3";
          goto LAB_0010d85d;
        }
      }
    }
    else {
LAB_0010d614:
      std::__cxx11::string::push_back(cVar8);
      while( true ) {
        uVar9 = uVar9 + 1;
        uVar10 = (ulong)uVar9;
        if ((input_arg->_M_string_length <= uVar10) ||
           (cVar2 = (input_arg->_M_dataplus)._M_p[uVar10], 'z' < cVar2)) break;
        if (cVar2 < 'a') {
          if (cVar2 < '[') {
            if (9 < (byte)(cVar2 - 0x30U) && cVar2 < 'A') break;
          }
          else if (cVar2 != '_') break;
        }
        std::__cxx11::string::push_back(cVar8);
      }
    }
LAB_0010d7a1:
    plVar5 = (list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this->input;
    p_Var6 = std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
             _M_create_node<std::__cxx11::string_const&>
                       (plVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_58);
    std::__detail::_List_node_base::_M_hook(&p_Var6->super__List_node_base);
    plVar5 = plVar5 + 0x10;
    *(long *)plVar5 = *(long *)plVar5 + 1;
    std::__cxx11::string::_M_replace((ulong)local_58,0,temp._M_dataplus._M_p,0x11031b);
  } while( true );
}

Assistant:

void MathInterpreter::separateInput(string input_arg) {//-rol/70
  string temp = "";
  unsigned int start = 0, count = 0;
  //check negative number in begining of string
  if ((input_arg[start] == '-') && (input_arg.size() > 1)
      && (input_arg[1] <= '9') && (input_arg[1] >= '0')) {
    temp += input_arg[start];
    start++;
    while ((start < input_arg.size())
        && (((input_arg[start] <= '9') && (input_arg[start] >= '0'))
            || (input_arg[start] == '.'))) {
      if (input_arg[start] == '.') {
        count++;
      }
      temp += input_arg[start];
      start++;
    }
    if (count > 1) {
      throw ("Invalid input");
    }
    this->input->push_back(temp);
    temp = "";
  }
  while (start < input_arg.size()) {
    if (((input_arg[start] <= 'z') && (input_arg[start] >= 'a'))
        || ((input_arg[start] <= 'Z') && (input_arg[start] >= 'A'))) {
      temp += input_arg[start];
      start++;
      while (start < input_arg.size()
          && (((input_arg[start] <= 'z') && (input_arg[start] >= 'a'))
              || ((input_arg[start] <= 'Z') && (input_arg[start] >= 'A'))
              || (input_arg[start] == '_')
              || ((input_arg[start] <= '9') && (input_arg[start] >= '0')))) {
        temp += input_arg[start];
        start++;
      }
    } else if ((input_arg[start] <= '9') && (input_arg[start] >= '0')) {
      temp += input_arg[start];
      start++;
      while ((start < input_arg.size())
          && (((input_arg[start] <= '9') && (input_arg[start] >= '0'))
              || (input_arg[start] == '.'))) {
        if (input_arg[start] == '.') {
          count++;
        }
        temp += input_arg[start];
        start++;
      }
      if (count > 1) {
        throw ("invalid input_arg3");
      }
    } else if ((input_arg[start] == '(') || (input_arg[start] == ')')
        || (input_arg[start] == '+') || (input_arg[start] == '-')
        || (input_arg[start] == '*') || (input_arg[start] == '/')) {
      //check for negative number in input_arg
      if ((input_arg[start] == '-') && (input_arg.size() > start + 1)
          && (start > 0) && (input_arg[start - 1] == '(')
          && (input_arg[start + 1] <= '9') && (input_arg[start + 1] >= '0')) {
        temp += (input_arg[start]);
        start++;
        temp += (input_arg[start]);
        start++;
        while ((start < input_arg.size())
            && (((input_arg[start] <= '9') && (input_arg[start] >= '0'))
                || (input_arg[start] == '.'))) {
          if (input_arg[start] == '.') {
            count++;
          }
          temp += input_arg[start];
          start++;
        }
      } else {
        temp += input_arg[start];
        start++;
      }
    } else {
      throw ("invalid input_arg2");
    }
    this->input->push_back(temp);
    temp = "";
  }
}